

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateKotlinDsl
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  OneofDescriptor *oneof;
  ImmutableFieldLiteGenerator *pIVar1;
  OneofGeneratorInfo *args_1;
  OneofGeneratorInfo *pOVar2;
  _Base_ptr p_Var3;
  int i;
  long lVar4;
  long lVar5;
  string local_50;
  
  io::Printer::Print<>
            (printer,
             "@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n@com.google.protobuf.kotlin.ProtoDslMarker\n"
            );
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_50,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "public class Dsl private constructor(\n  private val _builder: $message$.Builder\n) {\n  public companion object {\n    @kotlin.jvm.JvmSynthetic\n    @kotlin.PublishedApi\n    internal fun _create(builder: $message$.Builder): Dsl = Dsl(builder)\n  }\n\n  @kotlin.jvm.JvmSynthetic\n  @kotlin.PublishedApi\n  internal fun _build(): $message$ = _builder.build()\n"
             ,(char (*) [8])0x409be2,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  io::Printer::Indent(printer);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)((this->super_MessageGenerator).descriptor_ + 4);
      lVar4 = lVar4 + 1) {
    io::Printer::Print<>(printer,"\n");
    pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar5));
    (*pIVar1->_vptr_ImmutableFieldLiteGenerator[8])(pIVar1,printer);
    lVar5 = lVar5 + 0x48;
  }
  for (p_Var3 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    oneof = *(OneofDescriptor **)(p_Var3 + 1);
    args_1 = Context::GetOneofGeneratorInfo(this->context_,oneof);
    pOVar2 = Context::GetOneofGeneratorInfo(this->context_,oneof);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_50,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    io::Printer::
    Print<char[11],std::__cxx11::string,char[23],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,
               "public val $oneof_name$Case: $message$.$oneof_capitalized_name$Case\n  @JvmName(\"get$oneof_capitalized_name$Case\")\n  get() = _builder.get$oneof_capitalized_name$Case()\n\npublic fun clear$oneof_capitalized_name$() {\n  _builder.clear$oneof_capitalized_name$()\n}\n"
               ,(char (*) [11])0x3e5415,&args_1->name,(char (*) [23])"oneof_capitalized_name",
               &pOVar2->capitalized_name,(char (*) [8])0x409be2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    GenerateKotlinExtensions(this,printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateKotlinDsl(
    io::Printer* printer) const {
  printer->Print(
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "@com.google.protobuf.kotlin.ProtoDslMarker\n");
  printer->Print(
      "public class Dsl private constructor(\n"
      "  private val _builder: $message$.Builder\n"
      ") {\n"
      "  public companion object {\n"
      "    @kotlin.jvm.JvmSynthetic\n"
      "    @kotlin.PublishedApi\n"
      "    internal fun _create(builder: $message$.Builder): Dsl = "
      "Dsl(builder)\n"
      "  }\n"
      "\n"
      "  @kotlin.jvm.JvmSynthetic\n"
      "  @kotlin.PublishedApi\n"
      "  internal fun _build(): $message$ = _builder.build()\n",
      "message", name_resolver_->GetClassName(descriptor_, true));

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateKotlinDslMembers(printer);
  }

  for (auto oneof : oneofs_) {
    printer->Print(
        "public val $oneof_name$Case: $message$.$oneof_capitalized_name$Case\n"
        "  @JvmName(\"get$oneof_capitalized_name$Case\")\n"
        "  get() = _builder.get$oneof_capitalized_name$Case()\n\n"
        "public fun clear$oneof_capitalized_name$() {\n"
        "  _builder.clear$oneof_capitalized_name$()\n"
        "}\n",
        "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name,
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "message",
        name_resolver_->GetClassName(descriptor_, true));
  }

  if (descriptor_->extension_range_count() > 0) {
    GenerateKotlinExtensions(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
}